

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O1

void __thiscall solitaire::graphics::Renderer::setButtonsAlpha(Renderer *this)

{
  uint uVar1;
  GraphicsSystem *pGVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var5;
  undefined8 uVar6;
  uint *puVar7;
  uint *puVar8;
  uint local_18;
  uint local_14;
  uint local_10;
  uint local_c;
  
  puVar8 = &local_18;
  iVar4 = (*this->context->_vptr_Context[0xd])();
  cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x20))
                    ((long *)CONCAT44(extraout_var,iVar4));
  pGVar2 = (this->graphicsSystem)._M_t.
           super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>.
           _M_head_impl;
  uVar1 = (this->newGameId).t;
  if (cVar3 == '\0') {
    puVar7 = &local_10;
    pp_Var5 = pGVar2->_vptr_GraphicsSystem;
    uVar6 = 0x96;
    local_10 = uVar1;
  }
  else {
    puVar7 = &local_c;
    pp_Var5 = pGVar2->_vptr_GraphicsSystem;
    uVar6 = 0xff;
    local_c = uVar1;
  }
  (*pp_Var5[4])(pGVar2,puVar7,uVar6);
  iVar4 = (*this->context->_vptr_Context[0xf])();
  cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x20))
                    ((long *)CONCAT44(extraout_var_00,iVar4));
  pGVar2 = (this->graphicsSystem)._M_t.
           super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>.
           _M_head_impl;
  uVar1 = (this->undoId).t;
  if (cVar3 == '\0') {
    pp_Var5 = pGVar2->_vptr_GraphicsSystem;
    uVar6 = 0x96;
    local_18 = uVar1;
  }
  else {
    puVar8 = &local_14;
    pp_Var5 = pGVar2->_vptr_GraphicsSystem;
    uVar6 = 0xff;
    local_14 = uVar1;
  }
  (*pp_Var5[4])(pGVar2,puVar8,uVar6);
  return;
}

Assistant:

void Renderer::setButtonsAlpha() const {
    if (context.getNewGameButton().isHovered())
        graphicsSystem->setTextureAlpha(newGameId, noAlpha);
    else
        graphicsSystem->setTextureAlpha(newGameId, buttonAlpha);

    if (context.getUndoButton().isHovered())
        graphicsSystem->setTextureAlpha(undoId, noAlpha);
    else
        graphicsSystem->setTextureAlpha(undoId, buttonAlpha);
}